

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_header.c
# Opt level: O0

char * cmime_header_get_value(CMimeHeader_T *header,int pos)

{
  int pos_local;
  CMimeHeader_T *header_local;
  
  if (header == (CMimeHeader_T *)0x0) {
    __assert_fail("header",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                  ,0x59,"char *cmime_header_get_value(CMimeHeader_T *, int)");
  }
  if ((ulong)(long)pos <= header->count) {
    if (header->value == (char **)0x0) {
      header_local = (CMimeHeader_T *)0x0;
    }
    else {
      header_local = (CMimeHeader_T *)header->value[pos];
    }
    return (char *)header_local;
  }
  __assert_fail("pos <= header->count",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                ,0x5a,"char *cmime_header_get_value(CMimeHeader_T *, int)");
}

Assistant:

char *cmime_header_get_value(CMimeHeader_T *header,int pos) {
    assert(header);
    assert(pos <= header->count);
    
    if (header->value != NULL)
        return(header->value[pos]);
    else
        return(NULL);
}